

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O2

int skip_to_next_token(void)

{
  FILE *__stream;
  ushort *puVar1;
  uint uVar2;
  int iVar3;
  ushort **ppuVar4;
  
  do {
    if (file_stack_ptr < 1) {
      return -1;
    }
    uVar2 = file_stack_ptr - 1;
    __stream = (FILE *)file_stack[uVar2].fp;
    ppuVar4 = __ctype_b_loc();
LAB_00105746:
    puVar1 = *ppuVar4;
    iVar3 = fgetc(__stream);
    if ((*(byte *)((long)puVar1 + (long)iVar3 * 2 + 1) & 0x20) != 0) break;
    if (iVar3 == 0x3b) {
      do {
        iVar3 = getc(__stream);
        if (iVar3 == -1) goto LAB_00105746;
      } while (iVar3 != 10);
      goto LAB_00105779;
    }
    if (iVar3 != -1) {
      return iVar3;
    }
    close_file();
  } while( true );
  if (iVar3 == 10) {
LAB_00105779:
    file_stack[uVar2].lineno = file_stack[uVar2].lineno + 1;
  }
  goto LAB_00105746;
}

Assistant:

int
skip_to_next_token ()
{
  InputFile *f;
  FILE *fp;
  int c;

  /* Skip leading whitespace & handle EOF by popping up one file. */
  while (1)
    {
      if (file_stack_ptr <= 0)
	return EOF;

      f = &file_stack[file_stack_ptr - 1];
      fp = f->fp;

      /* Skip leading spaces & comments */
      while (1)
	{
	  while (isspace (c = fgetc (fp)))  /* Linux dies if you use getc. */
	    if (c == '\n') f->lineno++;
	  
	  if (c == ';')    /* Skip over comments */
	    {
	      while ((c = getc (fp)) != '\n' && c != EOF);
	      if (c == '\n') f->lineno++;
	    }
	  else break;
	}
  
      if (c == EOF)
	close_file ();
      else break;
    }

  return c;
}